

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::ParseContext::
ParseGroup<google::protobuf::internal::UnknownFieldLiteParserHelper>
          (ParseContext *this,UnknownFieldLiteParserHelper *msg,char *ptr,uint32_t tag)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  uint32_t uVar4;
  char *pcVar5;
  char *pcVar6;
  
  iVar3 = this->depth_;
  this->depth_ = iVar3 + -1;
  if (iVar3 < 1) {
    pcVar6 = (char *)0x0;
  }
  else {
    this->group_depth_ = this->group_depth_ + 1;
    pcVar5 = WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                       (msg,ptr,this);
    uVar1 = this->depth_;
    uVar2 = this->group_depth_;
    this->depth_ = uVar1 + 1;
    this->group_depth_ = uVar2 + -1;
    uVar4 = (this->super_EpsCopyInputStream).last_tag_minus_1_;
    (this->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    pcVar6 = (char *)0x0;
    if (uVar4 == tag) {
      pcVar6 = pcVar5;
    }
  }
  return pcVar6;
}

Assistant:

PROTOBUF_NODISCARD PROTOBUF_NDEBUG_INLINE const char* ParseGroup(
      T* msg, const char* ptr, uint32_t tag) {
    if (--depth_ < 0) return nullptr;
    group_depth_++;
    ptr = msg->_InternalParse(ptr, this);
    group_depth_--;
    depth_++;
    if (PROTOBUF_PREDICT_FALSE(!ConsumeEndGroup(tag))) return nullptr;
    return ptr;
  }